

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioNative.cpp
# Opt level: O0

void chatra::emb::io::parsePositionArgs
               (Ct *ct,size_t offsetIndex,size_t lengthIndex,ptrdiff_t bufferSize,ptrdiff_t *offset,
               ptrdiff_t *length)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  undefined4 extraout_var_00;
  IllegalArgumentException *pIVar3;
  ptrdiff_t *length_local;
  ptrdiff_t *offset_local;
  ptrdiff_t bufferSize_local;
  size_t lengthIndex_local;
  size_t offsetIndex_local;
  Ct *ct_local;
  
  iVar1 = (*ct->_vptr_NativeCallContext[10])(ct,offsetIndex);
  lVar2 = NativeReference::get<long,_nullptr>((NativeReference *)CONCAT44(extraout_var,iVar1));
  *offset = lVar2;
  iVar1 = (*ct->_vptr_NativeCallContext[10])();
  lVar2 = NativeReference::get<long,_nullptr>((NativeReference *)CONCAT44(extraout_var_00,iVar1));
  *length = lVar2;
  if (*offset < 0) {
    *offset = bufferSize + *offset;
  }
  if (*offset < 0) {
    pIVar3 = (IllegalArgumentException *)__cxa_allocate_exception(0x28);
    memset(pIVar3,0,0x28);
    IllegalArgumentException::IllegalArgumentException(pIVar3);
    __cxa_throw(pIVar3,&IllegalArgumentException::typeinfo,
                IllegalArgumentException::~IllegalArgumentException);
  }
  if (*length < 0) {
    *length = bufferSize - *offset;
  }
  if ((-1 < *length) && (*offset + *length <= bufferSize)) {
    return;
  }
  pIVar3 = (IllegalArgumentException *)__cxa_allocate_exception(0x28);
  memset(pIVar3,0,0x28);
  IllegalArgumentException::IllegalArgumentException(pIVar3);
  __cxa_throw(pIVar3,&IllegalArgumentException::typeinfo,
              IllegalArgumentException::~IllegalArgumentException);
}

Assistant:

static void parsePositionArgs(Ct& ct, size_t offsetIndex, size_t lengthIndex, ptrdiff_t bufferSize,
		ptrdiff_t& offset, ptrdiff_t& length) {

	offset = ct.at(offsetIndex).get<ptrdiff_t>();
	length = ct.at(lengthIndex).get<ptrdiff_t>();

	if (offset < 0)
		offset = bufferSize + offset;
	if (offset < 0)
		throw IllegalArgumentException();
	if (length < 0)
		length = bufferSize - offset;
	if (length < 0 || offset + length > bufferSize)
		throw IllegalArgumentException();
}